

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

DecodeStatus decodeBDAddr20Operand(MCInst *Inst,uint64_t Field,uint *Regs)

{
  int64_t Val;
  uint local_3c;
  uint64_t Disp;
  uint64_t Base;
  uint *Regs_local;
  uint64_t Field_local;
  MCInst *Inst_local;
  
  if (Field >> 0x14 == 0) {
    local_3c = 0;
  }
  else {
    local_3c = Regs[Field >> 0x14];
  }
  MCOperand_CreateReg0(Inst,local_3c);
  Val = SignExtend64((Field & 0xff) << 0xc | Field >> 8 & 0xfff,0x14);
  MCOperand_CreateImm0(Inst,Val);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus decodeBDAddr20Operand(MCInst *Inst, uint64_t Field,
		const unsigned *Regs)
{
	uint64_t Base = Field >> 20;
	uint64_t Disp = ((Field << 12) & 0xff000) | ((Field >> 8) & 0xfff);
	//assert(Base < 16 && "Invalid BDAddr20");

	MCOperand_CreateReg0(Inst, Base == 0 ? 0 : Regs[Base]);
	MCOperand_CreateImm0(Inst, SignExtend64(Disp, 20));
	return MCDisassembler_Success;
}